

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# api.hpp
# Opt level: O0

API<Args::CmdLine,_Args::Command,_std::unique_ptr<Args::ArgIface,_Args::details::Deleter<Args::ArgIface>_>,_false>
* __thiscall
Args::details::
API<Args::CmdLine,_Args::Command,_std::unique_ptr<Args::ArgIface,_Args::details::Deleter<Args::ArgIface>_>,_false>
::addMultiArgWithFlagOnlyAndDefaultValues
          (API<Args::CmdLine,_Args::Command,_std::unique_ptr<Args::ArgIface,_Args::details::Deleter<Args::ArgIface>_>,_false>
           *this,Char flag,bool isWithValue,bool isRequired,String *desc,String *longDesc,
          StringList *defaultValues,String *valueSpecifier)

{
  bool bVar1;
  ulong uVar2;
  byte in_CL;
  byte in_DL;
  API<Args::CmdLine,_Args::Command,_std::unique_ptr<Args::ArgIface,_Args::details::Deleter<Args::ArgIface>_>,_false>
  *in_RDI;
  unique_ptr<Args::ArgIface,_Args::details::Deleter<Args::ArgIface>_> a;
  unique_ptr<Args::MultiArg,_Args::details::Deleter<Args::ArgIface>_> arg;
  pointer in_stack_ffffffffffffff78;
  unique_ptr<Args::ArgIface,_Args::details::Deleter<Args::ArgIface>_> *puVar3;
  MultiArg *in_stack_ffffffffffffff80;
  Command *this_00;
  unique_ptr<Args::MultiArg,_Args::details::Deleter<Args::ArgIface>_> *in_stack_ffffffffffffff88;
  undefined1 *puVar4;
  undefined1 local_60 [16];
  unique_ptr<Args::ArgIface,_Args::details::Deleter<Args::ArgIface>_> local_50;
  Deleter<Args::ArgIface> local_3d [50];
  byte local_b;
  byte local_a;
  
  local_a = in_DL & 1;
  local_b = in_CL & 1;
  operator_new(0x130);
  MultiArg::MultiArg(in_stack_ffffffffffffff80,(Char)((ulong)in_stack_ffffffffffffff78 >> 0x38),
                     SUB81((ulong)in_stack_ffffffffffffff78 >> 0x30,0),
                     SUB81((ulong)in_stack_ffffffffffffff78 >> 0x28,0));
  Deleter<Args::ArgIface>::Deleter(local_3d,true);
  std::unique_ptr<Args::MultiArg,Args::details::Deleter<Args::ArgIface>>::
  unique_ptr<Args::details::Deleter<Args::ArgIface>,void>
            ((unique_ptr<Args::MultiArg,_Args::details::Deleter<Args::ArgIface>_> *)
             in_stack_ffffffffffffff80,in_stack_ffffffffffffff78,
             (__enable_if_t<_is_lvalue_reference<Deleter<ArgIface>_>::value,_Args::details::Deleter<Args::ArgIface>_&&>
              )0x177522);
  uVar2 = std::__cxx11::string::empty();
  if ((uVar2 & 1) == 0) {
    std::unique_ptr<Args::MultiArg,_Args::details::Deleter<Args::ArgIface>_>::operator->
              ((unique_ptr<Args::MultiArg,_Args::details::Deleter<Args::ArgIface>_> *)0x17753a);
    Arg::setDescription(&in_stack_ffffffffffffff80->super_Arg,(String *)in_stack_ffffffffffffff78);
  }
  uVar2 = std::__cxx11::string::empty();
  if ((uVar2 & 1) == 0) {
    std::unique_ptr<Args::MultiArg,_Args::details::Deleter<Args::ArgIface>_>::operator->
              ((unique_ptr<Args::MultiArg,_Args::details::Deleter<Args::ArgIface>_> *)0x177598);
    Arg::setLongDescription
              (&in_stack_ffffffffffffff80->super_Arg,(String *)in_stack_ffffffffffffff78);
  }
  bVar1 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::empty((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)in_RDI);
  if (!bVar1) {
    std::unique_ptr<Args::MultiArg,_Args::details::Deleter<Args::ArgIface>_>::operator->
              ((unique_ptr<Args::MultiArg,_Args::details::Deleter<Args::ArgIface>_> *)0x1775c4);
    MultiArg::setDefaultValues(in_stack_ffffffffffffff80,(StringList *)in_stack_ffffffffffffff78);
  }
  uVar2 = std::__cxx11::string::empty();
  if ((uVar2 & 1) == 0) {
    std::unique_ptr<Args::MultiArg,_Args::details::Deleter<Args::ArgIface>_>::operator->
              ((unique_ptr<Args::MultiArg,_Args::details::Deleter<Args::ArgIface>_> *)0x1775f3);
    Arg::setValueSpecifier
              (&in_stack_ffffffffffffff80->super_Arg,(String *)in_stack_ffffffffffffff78);
  }
  puVar3 = &local_50;
  std::unique_ptr<Args::ArgIface,Args::details::Deleter<Args::ArgIface>>::
  unique_ptr<Args::MultiArg,Args::details::Deleter<Args::ArgIface>,void>
            ((unique_ptr<Args::ArgIface,_Args::details::Deleter<Args::ArgIface>_> *)in_RDI,
             in_stack_ffffffffffffff88);
  this_00 = in_RDI->m_self;
  puVar4 = local_60;
  std::unique_ptr<Args::ArgIface,_Args::details::Deleter<Args::ArgIface>_>::unique_ptr
            ((unique_ptr<Args::ArgIface,_Args::details::Deleter<Args::ArgIface>_> *)this_00,puVar3);
  (**(code **)(*(long *)&((tuple<Args::ArgIface_*,_Args::details::Deleter<Args::ArgIface>_> *)
                         &(this_00->super_GroupIface).super_ArgIface._vptr_ArgIface)->
                         super__Tuple_impl<0UL,_Args::ArgIface_*,_Args::details::Deleter<Args::ArgIface>_>
              + 0x98))(this_00,puVar4);
  std::unique_ptr<Args::ArgIface,_Args::details::Deleter<Args::ArgIface>_>::~unique_ptr
            ((unique_ptr<Args::ArgIface,_Args::details::Deleter<Args::ArgIface>_> *)this_00);
  std::unique_ptr<Args::ArgIface,_Args::details::Deleter<Args::ArgIface>_>::~unique_ptr
            ((unique_ptr<Args::ArgIface,_Args::details::Deleter<Args::ArgIface>_> *)this_00);
  std::unique_ptr<Args::MultiArg,_Args::details::Deleter<Args::ArgIface>_>::~unique_ptr
            ((unique_ptr<Args::MultiArg,_Args::details::Deleter<Args::ArgIface>_> *)this_00);
  return in_RDI;
}

Assistant:

API< PARENT, Command, ARGPTR, false > & addMultiArgWithFlagOnlyAndDefaultValues(
		//! Flag for this argument.
		Char flag,
		//! Is this argument with value?
		bool isWithValue = false,
		//! Is this argument required?
		bool isRequired = false,
		//! Description of the argument.
		const String & desc = String(),
		//! Long description.
		const String & longDesc = String(),
		//! Default value.
		const StringList & defaultValues = StringList(),
		//! Value specifier.
		const String & valueSpecifier = String() )
	{

		auto arg = std::unique_ptr< MultiArg, details::Deleter< ArgIface > > (
			new MultiArg( flag, isWithValue, isRequired ),
			details::Deleter< ArgIface > ( true ) );

		if( !desc.empty() )
			arg->setDescription( desc );

		if( !longDesc.empty() )
			arg->setLongDescription( longDesc );

		if( !defaultValues.empty() )
			arg->setDefaultValues( defaultValues );

		if( !valueSpecifier.empty() )
			arg->setValueSpecifier( valueSpecifier );

		ARGPTR a = std::move( arg );

		m_self.addArg( std::move( a ) );

		return *this;
	}